

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O2

int str_to_blend_mode(string *str)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = std::operator==(str,"ZERO");
  iVar2 = 0;
  if (!bVar1) {
    bVar1 = std::operator==(str,"ONE");
    iVar2 = 1;
    if (!bVar1) {
      bVar1 = std::operator==(str,"SRC_COLOR");
      if (bVar1) {
        iVar2 = 4;
      }
      else {
        bVar1 = std::operator==(str,"DEST_COLOR");
        if (bVar1) {
          iVar2 = 5;
        }
        else {
          bVar1 = std::operator==(str,"INV_SRC_COLOR");
          if (bVar1) {
            iVar2 = 6;
          }
          else {
            bVar1 = std::operator==(str,"INV_DEST_COLOR");
            if (bVar1) {
              iVar2 = 7;
            }
            else {
              bVar1 = std::operator==(str,"ALPHA");
              iVar2 = 2;
              if (!bVar1) {
                bVar1 = std::operator==(str,"INVERSE");
                if (bVar1) {
                  iVar2 = 3;
                }
                else {
                  bVar1 = std::operator==(str,"ADD");
                  iVar2 = 0;
                  if (((!bVar1) &&
                      (bVar1 = std::operator==(str,"SRC_MINUS_DEST"), iVar2 = 1, !bVar1)) &&
                     (bVar1 = std::operator==(str,"DEST_MINUS_SRC"), iVar2 = 2, !bVar1)) {
                    bVar1 = std::operator==(str,"CONST_COLOR");
                    if (bVar1) {
                      iVar2 = 8;
                    }
                    else {
                      bVar1 = std::operator==(str,"INV_CONST_COLOR");
                      iVar2 = (uint)bVar1 * 8 + 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int str_to_blend_mode(const std::string & str)
{
   if (str == "ZERO")
      return ALLEGRO_ZERO;
   if (str == "ONE")
      return ALLEGRO_ONE;
   if (str == "SRC_COLOR")
      return ALLEGRO_SRC_COLOR;
   if (str == "DEST_COLOR")
      return ALLEGRO_DEST_COLOR;
   if (str == "INV_SRC_COLOR")
      return ALLEGRO_INVERSE_SRC_COLOR;
   if (str == "INV_DEST_COLOR")
      return ALLEGRO_INVERSE_DEST_COLOR;
   if (str == "ALPHA")
      return ALLEGRO_ALPHA;
   if (str == "INVERSE")
      return ALLEGRO_INVERSE_ALPHA;
   if (str == "ADD")
      return ALLEGRO_ADD;
   if (str == "SRC_MINUS_DEST")
      return ALLEGRO_SRC_MINUS_DEST;
   if (str == "DEST_MINUS_SRC")
      return ALLEGRO_DEST_MINUS_SRC;
   if (str == "CONST_COLOR")
      return ALLEGRO_CONST_COLOR;
   if (str == "INV_CONST_COLOR")
      return ALLEGRO_INVERSE_CONST_COLOR;

   ALLEGRO_ASSERT(false);
   return ALLEGRO_ONE;
}